

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeProfileInfo.cpp
# Opt level: O2

CallbackInfo * __thiscall
JITTimeProfileInfo::FindCallbackInfo(JITTimeProfileInfo *this,ProfileId callSiteId)

{
  CallbackInfoIDL *pCVar1;
  CallbackInfoIDL *pCVar2;
  CallbackInfoIDL *pCVar3;
  ulong uVar4;
  
  uVar4 = 0xffffffffffffffff;
  pCVar3 = (this->m_profileData).callbackData + -1;
  do {
    uVar4 = uVar4 + 1;
    if ((this->m_profileData).profiledCallbackCount <= uVar4) {
      return (CallbackInfo *)0x0;
    }
    pCVar1 = pCVar3 + 1;
    pCVar2 = pCVar3 + 1;
    pCVar3 = pCVar1;
  } while (pCVar2->struct_pad_1 != callSiteId);
  return (CallbackInfo *)pCVar1;
}

Assistant:

Js::CallbackInfo * 
JITTimeProfileInfo::FindCallbackInfo(Js::ProfileId callSiteId) const
{
    Js::CallbackInfo * callbackInfo = GetCallbackInfo();
    for (size_t i = 0; i < m_profileData.profiledCallbackCount; ++i)
    {
        if (callbackInfo[i].callSiteId == callSiteId)
        {
            return &callbackInfo[i];
        }
    }
    return nullptr;
}